

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void CP_PeerFailCloseWSReader(WS_ReaderInfo CP_WSR_Stream,StreamStatus NewState)

{
  SstStream s;
  SstStream s_00;
  CPTimestepList p_Var1;
  _CPTimestepEntry *p_Var2;
  byte *pbVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  CP_PeerConnection *pCVar7;
  char *Format;
  long lVar8;
  long lVar9;
  
  s = CP_WSR_Stream->ParentStream;
  uVar6 = (ulong)s->Status;
  if (s->Status == Established) {
    if (CP_WSR_Stream->ReaderStatus != NewState) {
      CP_WSR_Stream->ReaderStatus = NewState;
      pthread_cond_signal((pthread_cond_t *)&s->DataCondition);
      if (NewState - PeerClosed < 3) {
        CP_verbose(s,PerRankVerbose,"In PeerFailCloseWSReader, releasing sent timesteps\n");
        s_00 = CP_WSR_Stream->ParentStream;
        p_Var1 = s_00->QueuedTimesteps;
        CP_verbose(s_00,PerRankVerbose,"Dereferencing all timesteps sent to reader %p\n",
                   CP_WSR_Stream);
        while (p_Var1 != (CPTimestepList)0x0) {
          p_Var2 = p_Var1->Next;
          CP_verbose(s_00,TraceVerbose,"Checking on timestep %ld\n",p_Var1->Timestep);
          DerefSentTimestep(s_00,CP_WSR_Stream,p_Var1->Timestep);
          p_Var1 = p_Var2;
        }
        CP_verbose(s_00,PerRankVerbose,"DONE DEREFERENCING\n");
        CP_WSR_Stream->OldestUnreleasedTimestep = CP_WSR_Stream->LastSentTimestep + 1;
        iVar4 = CP_WSR_Stream->ReaderCohortSize;
        if (0 < iVar4) {
          pCVar7 = CP_WSR_Stream->Connections;
          lVar8 = 0x10;
          lVar9 = 0;
          do {
            if (*(long *)((long)&pCVar7->ContactList + lVar8) != 0) {
              CMConnection_dereference();
              pCVar7 = CP_WSR_Stream->Connections;
              *(undefined8 *)((long)&pCVar7->ContactList + lVar8) = 0;
              iVar4 = CP_WSR_Stream->ReaderCohortSize;
            }
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + 0x18;
          } while (lVar9 < iVar4);
        }
        if (NewState == PeerFailed) {
          uVar5 = CMadd_delayed_task(s->CPInfo->SharedCM->cm,2,0,CloseWSRStream,CP_WSR_Stream);
          CMfree(uVar5);
        }
        else {
          pbVar3 = (byte *)s->ConfigParams->DataTransport;
          iVar4 = *pbVar3 - 0x6d;
          if ((iVar4 == 0) && (iVar4 = pbVar3[1] - 0x70, iVar4 == 0)) {
            iVar4 = 0x69 - (uint)pbVar3[2];
          }
          else {
            iVar4 = -iVar4;
          }
          if ((iVar4 == 0) && (CP_WSR_Stream->DP_WSR_Stream != (DP_RS_Stream)0x0)) {
            (*CP_WSR_Stream->ParentStream->DP_Interface->destroyWriterPerReader)
                      (&Svcs,CP_WSR_Stream->DP_WSR_Stream);
            CP_WSR_Stream->DP_WSR_Stream = (void *)0x0;
          }
        }
      }
      CP_verbose(s,PerStepVerbose,"Moving Reader stream %p to status %s\n",CP_WSR_Stream,
                 SSTStreamStatusStr[NewState]);
      QueueMaintenance(s);
      return;
    }
    Format = "In PeerFailCloseWSReader, but status is already set% d\n";
    uVar6 = 2;
  }
  else {
    Format = "In PeerFailCloseWSReader, but Parent status not Established, %d\n";
  }
  CP_verbose(s,TraceVerbose,Format,uVar6);
  return;
}

Assistant:

static void CP_PeerFailCloseWSReader(WS_ReaderInfo CP_WSR_Stream, enum StreamStatus NewState)
{
    SstStream ParentStream = CP_WSR_Stream->ParentStream;
    STREAM_ASSERT_LOCKED(ParentStream);
    if (ParentStream->Status != Established)
    {
        CP_verbose(ParentStream, TraceVerbose,
                   "In PeerFailCloseWSReader, but Parent status not Established, %d\n",
                   ParentStream->Status);
        return;
    }

    if (CP_WSR_Stream->ReaderStatus == NewState)
    {
        CP_verbose(ParentStream, TraceVerbose,
                   "In PeerFailCloseWSReader, but status is already set% d\n",
                   ParentStream->Status);
        return;
    }

    CP_WSR_Stream->ReaderStatus = NewState;
    STREAM_CONDITION_SIGNAL(ParentStream);

    if ((NewState == PeerClosed) || (NewState == Closed) || (NewState == PeerFailed))
    {
        // enter this on fail or deliberate close
        CP_verbose(ParentStream, PerRankVerbose,
                   "In PeerFailCloseWSReader, releasing sent timesteps\n");
        DerefAllSentTimesteps(CP_WSR_Stream->ParentStream, CP_WSR_Stream);
        CP_WSR_Stream->OldestUnreleasedTimestep = CP_WSR_Stream->LastSentTimestep + 1;
        for (int i = 0; i < CP_WSR_Stream->ReaderCohortSize; i++)
        {
            if (CP_WSR_Stream->Connections[i].CMconn)
            {
                CMConnection_dereference(CP_WSR_Stream->Connections[i].CMconn);
                CP_WSR_Stream->Connections[i].CMconn = NULL;
            }
        }
        if (NewState == PeerFailed)
        {
            // move to fully closed state later
            CMfree(CMadd_delayed_task(ParentStream->CPInfo->SharedCM->cm, 2, 0, CloseWSRStream,
                                      CP_WSR_Stream));
        }
        else
        {
            if (strncmp("mpi", ParentStream->ConfigParams->DataTransport, 3) == 0 &&
                CP_WSR_Stream->DP_WSR_Stream)
            {
                CP_WSR_Stream->ParentStream->DP_Interface->destroyWriterPerReader(
                    &Svcs, CP_WSR_Stream->DP_WSR_Stream);
                CP_WSR_Stream->DP_WSR_Stream = NULL;
            }
        }
    }
    CP_verbose(ParentStream, PerStepVerbose, "Moving Reader stream %p to status %s\n",
               (void *)CP_WSR_Stream, SSTStreamStatusStr[NewState]);

    QueueMaintenance(ParentStream);
}